

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.h
# Opt level: O0

Vector6d * gmath::combine(Vector6d *pose0,Vector6d *pose1)

{
  Vector6d *in_RDI;
  Vector3d T;
  Matrix33d R;
  SVector<double,_3> *in_stack_fffffffffffffeb0;
  Vector6d *in_stack_fffffffffffffeb8;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffec0;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffec8;
  Vector6d *in_stack_fffffffffffffee8;
  Vector3d *in_stack_fffffffffffffef0;
  Matrix33d *in_stack_fffffffffffffef8;
  SMatrix<double,_3,_3> local_60;
  
  getRotation(in_stack_fffffffffffffee8);
  getTranslation(in_stack_fffffffffffffeb8);
  SMatrix<double,_3,_3>::operator*
            (in_stack_fffffffffffffec8,(SVector<double,_3> *)in_stack_fffffffffffffec0);
  getTranslation(in_stack_fffffffffffffeb8);
  SVector<double,_3>::operator+
            ((SVector<double,_3> *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  getRotation(in_stack_fffffffffffffee8);
  operator*(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  SMatrix<double,_3,_3>::operator=(&local_60,(SMatrix<double,_3,_3> *)&stack0xfffffffffffffef8);
  getPose(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  return in_RDI;
}

Assistant:

inline Vector6d combine(const Vector6d &pose0, const Vector6d &pose1)
{
  Matrix33d R=getRotation(pose0);
  Vector3d  T=R*getTranslation(pose1)+getTranslation(pose0);
  R=R*getRotation(pose1);
  return getPose(R, T);
}